

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert<int_const*>(void *param_1)

{
  unsigned_long uVar1;
  length_error *this;
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  size_t dist;
  size_type in_stack_00000070;
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000078;
  int *in_stack_ffffffffffffff88;
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffffa0;
  ulong uVar2;
  ulong local_28;
  int *in_stack_fffffffffffffff8;
  
  local_28 = std::distance<int_const*>(in_stack_ffffffffffffffa0,(int *)param_1);
  uVar2 = local_28;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 <= uVar2) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"insert-range overflow");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(in_stack_00000078,in_stack_00000070);
  for (; local_28 != 0; local_28 = local_28 - 1) {
    get_key<int_const&>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    insert_noresize<int,int_const&>(unaff_retaddr,in_stack_fffffffffffffff8,(int *)param_1);
  }
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(get_key(*f), *f);
    }
  }